

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

CURLcode ossl_connect(Curl_easy *data,connectdata *conn,int sockindex)

{
  _Bool local_29 [5];
  int iStack_24;
  _Bool done;
  CURLcode result;
  int sockindex_local;
  connectdata *conn_local;
  Curl_easy *data_local;
  
  local_29[0] = false;
  iStack_24 = sockindex;
  _result = conn;
  conn_local = (connectdata *)data;
  data_local._4_4_ = ossl_connect_common(data,conn,sockindex,false,local_29);
  if (data_local._4_4_ == CURLE_OK) {
    data_local._4_4_ = CURLE_OK;
  }
  return data_local._4_4_;
}

Assistant:

static CURLcode ossl_connect(struct Curl_easy *data, struct connectdata *conn,
                             int sockindex)
{
  CURLcode result;
  bool done = FALSE;

  result = ossl_connect_common(data, conn, sockindex, FALSE, &done);
  if(result)
    return result;

  DEBUGASSERT(done);

  return CURLE_OK;
}